

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoBinop<double,double>(Thread *this,BinopFunc<double,_double> *f)

{
  undefined8 extraout_RDX;
  double dVar1;
  Value VVar2;
  Value VVar3;
  
  VVar2 = Pop(this);
  VVar3 = Pop(this);
  dVar1 = (*f)((double)VVar3.i64_,(double)VVar2.i64_);
  VVar2._8_8_ = extraout_RDX;
  VVar2.f64_ = (f64)dVar1;
  Push(this,VVar2);
  return Ok;
}

Assistant:

RunResult Thread::DoBinop(BinopFunc<R, T> f) {
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  Push<R>(f(lhs, rhs));
  return RunResult::Ok;
}